

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls.c
# Opt level: O1

_Bool AES_CCM_Encrypt(COSE_Enveloped *pcose,int TSize,int LSize,byte *pbKey,size_t cbKey,
                     byte *pbAuthData,size_t cbAuthData,cose_errback *perr)

{
  size_t length;
  _Bool _Var1;
  int iVar2;
  cose_error cVar3;
  cn_cbor *pcVar4;
  uint8_t *output;
  _Bool _Var5;
  int iVar6;
  cn_cbor *cb_value;
  byte *pb;
  size_t __nmemb;
  cn_cbor_errback cbor_error;
  byte rgbIV [16];
  mbedtls_ccm_context ctx;
  
  iVar6 = LSize + 7;
  if (-1 < LSize) {
    iVar6 = LSize;
  }
  iVar6 = 0xf - (iVar6 >> 3);
  mbedtls_ccm_init(&ctx);
  pcVar4 = _COSE_map_get_int(&pcose->m_message,5,7,perr);
  if (pcVar4 == (cn_cbor *)0x0) {
    __nmemb = (size_t)iVar6;
    pb = (byte *)calloc(__nmemb,1);
    if (pb == (byte *)0x0) {
LAB_0019ba59:
      cVar3 = COSE_ERR_OUT_OF_MEMORY;
      goto LAB_0019ba5e;
    }
    rand_bytes(pb,__nmemb);
    memcpy(rgbIV,pb,__nmemb);
    pcVar4 = cn_cbor_data_create(pb,iVar6,&cbor_error);
    if (pcVar4 == (cn_cbor *)0x0) {
      if (perr == (cose_errback *)0x0) {
        output = (uint8_t *)0x0;
        pcVar4 = (cn_cbor *)0x0;
        cb_value = (cn_cbor *)0x0;
        goto LAB_0019ba85;
      }
      cVar3 = _MapFromCBOR(cbor_error);
      output = (uint8_t *)0x0;
      cb_value = (cn_cbor *)0x0;
      goto LAB_0019ba80;
    }
    _Var1 = _COSE_map_put(&pcose->m_message,5,pcVar4,2,perr);
    if (_Var1) goto LAB_0019b99c;
    output = (uint8_t *)0x0;
    cb_value = (cn_cbor *)0x0;
    pb = (byte *)0x0;
  }
  else {
    if ((pcVar4->type == CN_CBOR_BYTES) && (pcVar4->length == iVar6)) {
      memcpy(rgbIV,(pcVar4->v).bytes,(long)pcVar4->length);
LAB_0019b99c:
      iVar2 = mbedtls_ccm_setkey(&ctx,MBEDTLS_CIPHER_ID_AES,pbKey,(int)cbKey << 3);
      if (iVar2 != 0) {
        cVar3 = COSE_ERR_CRYPTO_FAIL;
        goto LAB_0019ba5e;
      }
      iVar2 = TSize + 7;
      if (-1 < TSize) {
        iVar2 = TSize;
      }
      iVar2 = iVar2 >> 3;
      length = pcose->cbContent;
      output = (uint8_t *)calloc((long)((int)length + iVar2),1);
      if (output == (uint8_t *)0x0) goto LAB_0019ba59;
      iVar6 = mbedtls_ccm_encrypt_and_tag
                        (&ctx,length,rgbIV,(long)iVar6,pbAuthData,cbAuthData,pcose->pbContent,output
                         ,output + length,(long)iVar2);
      if (iVar6 == 0) {
        cb_value = cn_cbor_data_create(output,iVar2 + (int)pcose->cbContent,(cn_cbor_errback *)0x0);
        if (cb_value == (cn_cbor *)0x0) {
          cVar3 = COSE_ERR_CBOR;
          goto LAB_0019ba54;
        }
        _Var1 = _COSE_array_replace(&pcose->m_message,cb_value,2,(cn_cbor_errback *)0x0);
        _Var5 = true;
        if (_Var1) goto LAB_0019babb;
        cVar3 = COSE_ERR_CBOR;
        output = (uint8_t *)0x0;
      }
      else {
        cVar3 = COSE_ERR_CRYPTO_FAIL;
LAB_0019ba54:
        cb_value = (cn_cbor *)0x0;
      }
    }
    else {
      cVar3 = COSE_ERR_INVALID_PARAMETER;
LAB_0019ba5e:
      output = (uint8_t *)0x0;
      cb_value = (cn_cbor *)0x0;
    }
    pb = (byte *)0x0;
    pcVar4 = (cn_cbor *)0x0;
    if (perr != (cose_errback *)0x0) {
LAB_0019ba80:
      perr->err = cVar3;
      pcVar4 = (cn_cbor *)0x0;
    }
  }
LAB_0019ba85:
  if (pb != (byte *)0x0) {
    free(pb);
  }
  if (pcVar4 != (cn_cbor *)0x0) {
    free(pcVar4);
  }
  if (output != (uint8_t *)0x0) {
    free(output);
  }
  if (cb_value != (cn_cbor *)0x0) {
    free(cb_value);
  }
  _Var5 = false;
LAB_0019babb:
  mbedtls_ccm_free(&ctx);
  return _Var5;
}

Assistant:

bool AES_CCM_Encrypt(COSE_Enveloped * pcose, int TSize, int LSize, const byte * pbKey, size_t cbKey, const byte * pbAuthData, size_t cbAuthData, cose_errback * perr)
{
	mbedtls_ccm_context ctx;
	int cbOut;
	byte * rgbOut = NULL;
	int NSize = 15 - (LSize/8);
	const cn_cbor * cbor_iv = NULL;
	cn_cbor * cbor_iv_t = NULL;
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context = &pcose->m_message.m_allocContext;
#endif
	cn_cbor * cnTmp = NULL;
	mbedtls_cipher_id_t cipher;
	byte rgbIV[16];
	byte * pbIV = NULL;
	cn_cbor_errback cbor_error;

        mbedtls_ccm_init(&ctx);

	cipher = MBEDTLS_CIPHER_ID_AES;			
	
	//  Setup the IV/Nonce and put it into the message
	cbor_iv = _COSE_map_get_int(&pcose->m_message, COSE_Header_IV, COSE_BOTH, perr);
	if (cbor_iv == NULL) {
	
                pbIV = COSE_CALLOC(NSize, 1, context);
		CHECK_CONDITION(pbIV != NULL, COSE_ERR_OUT_OF_MEMORY);
		rand_bytes(pbIV, NSize);
		memcpy(rgbIV, pbIV, NSize);
		cbor_iv_t = cn_cbor_data_create(pbIV, NSize, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
		CHECK_CONDITION_CBOR(cbor_iv_t != NULL, cbor_error);
		pbIV = NULL;

		if (!_COSE_map_put(&pcose->m_message, COSE_Header_IV, cbor_iv_t, COSE_UNPROTECT_ONLY, perr)) goto errorReturn;
		cbor_iv_t = NULL;
	}
	else {
		CHECK_CONDITION(cbor_iv->type == CN_CBOR_BYTES, COSE_ERR_INVALID_PARAMETER);
		CHECK_CONDITION(cbor_iv->length == NSize, COSE_ERR_INVALID_PARAMETER);
		memcpy(rgbIV, cbor_iv->v.str, cbor_iv->length);
	}

	//  Setup and run the mbedTLS code
	
	//cbKey comes in bytes not bits
 	CHECK_CONDITION(!mbedtls_ccm_setkey(&ctx, cipher, pbKey, cbKey*8), COSE_ERR_CRYPTO_FAIL);
	
	TSize /= 8; // Comes in in bits not bytes.

        cbOut = pcose->cbContent; // M00BUG - This is a missing call?
	rgbOut = (byte *)COSE_CALLOC(cbOut+TSize, 1, context);
	CHECK_CONDITION(rgbOut != NULL, COSE_ERR_OUT_OF_MEMORY);

	CHECK_CONDITION(!mbedtls_ccm_encrypt_and_tag(&ctx, pcose->cbContent, rgbIV, NSize, pbAuthData, cbAuthData, pcose->pbContent, rgbOut, &rgbOut[pcose->cbContent], TSize), COSE_ERR_CRYPTO_FAIL);	

	cnTmp = cn_cbor_data_create(rgbOut, (int)pcose->cbContent + TSize, CBOR_CONTEXT_PARAM_COMMA NULL);
	CHECK_CONDITION(cnTmp != NULL, COSE_ERR_CBOR);
	rgbOut = NULL;

	CHECK_CONDITION(_COSE_array_replace(&pcose->m_message, cnTmp, INDEX_BODY, CBOR_CONTEXT_PARAM_COMMA NULL), COSE_ERR_CBOR);
	cnTmp = NULL;

	mbedtls_ccm_free(&ctx);
	
	return true;

errorReturn:
	if (pbIV != NULL) COSE_FREE(pbIV, context);
	if (cbor_iv_t != NULL) COSE_FREE(cbor_iv_t, context);
	if (rgbOut != NULL) COSE_FREE(rgbOut, context);
	if (cnTmp != NULL) COSE_FREE(cnTmp, context);
	mbedtls_ccm_free(&ctx);
	return false;
}